

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::mz_zip_get_file_modified_time
                  (char *pFilename,mz_uint16 *pDOS_time,mz_uint16 *pDOS_date)

{
  int iVar1;
  char *in_RDI;
  stat64 file_stat;
  mz_uint16 *in_stack_ffffffffffffff50;
  mz_uint16 *in_stack_ffffffffffffff58;
  __nlink_t in_stack_ffffffffffffff60;
  uint local_4;
  
  iVar1 = stat64(in_RDI,(stat64 *)&stack0xffffffffffffff50);
  if (iVar1 == 0) {
    mz_zip_time_to_dos_time
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static mz_bool mz_zip_get_file_modified_time(const char *pFilename,
                                             mz_uint16 *pDOS_time,
                                             mz_uint16 *pDOS_date) {
#ifdef MINIZ_NO_TIME
  (void)pFilename;
  *pDOS_date = *pDOS_time = 0;
#else
  struct MZ_FILE_STAT_STRUCT file_stat;
  // On Linux with x86 glibc, this call will fail on large files (>= 0x80000000
  // bytes) unless you compiled with _LARGEFILE64_SOURCE. Argh.
  if (MZ_FILE_STAT(pFilename, &file_stat) != 0)
    return MZ_FALSE;
  mz_zip_time_to_dos_time(file_stat.st_mtime, pDOS_time, pDOS_date);
#endif // #ifdef MINIZ_NO_TIME
  return MZ_TRUE;
}